

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  ID id;
  Parameter *pPVar1;
  CombinedImageSamplerParameter *pCVar2;
  Parameter *pPVar3;
  size_t sVar4;
  Compiler *pCVar5;
  bool bVar6;
  uint32_t id_00;
  long lVar7;
  SPIRType *pSVar8;
  SPIRType *this_00;
  SPIRType *this_01;
  long lVar9;
  Parameter *pPVar10;
  difference_type __trip_count;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  Parameter *pPVar12;
  Parameter *pPVar13;
  CombinedImageSamplerParameter *pCVar14;
  CombinedImageSamplerParameter *__it;
  uint32_t ptr_type_id;
  CombinedImageSamplerParameter param;
  undefined1 local_a0 [8];
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *local_80;
  SPIRFunction *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  param.id.id = 0;
  param.global_image = true;
  param.global_sampler = true;
  pPVar3 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar4 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  lVar7 = sVar4 * 0x14;
  pPVar1 = pPVar3 + sVar4;
  lVar11 = (long)sVar4 >> 2;
  pPVar12 = pPVar3;
  for (lVar9 = lVar11; pPVar10 = pPVar12, 0 < lVar9; lVar9 = lVar9 + -1) {
    if ((pPVar12->id).id == image_id.id) goto LAB_00286dc3;
    if (pPVar12[1].id.id == image_id.id) {
      pPVar10 = pPVar12 + 1;
      goto LAB_00286dc3;
    }
    if (pPVar12[2].id.id == image_id.id) {
      pPVar10 = pPVar12 + 2;
      goto LAB_00286dc3;
    }
    if (pPVar12[3].id.id == image_id.id) {
      pPVar10 = pPVar12 + 3;
      goto LAB_00286dc3;
    }
    pPVar12 = pPVar12 + 4;
    lVar7 = lVar7 + -0x50;
  }
  lVar7 = lVar7 / 0x14;
  if (lVar7 == 1) {
LAB_00286da2:
    pPVar10 = pPVar12;
    if ((pPVar12->id).id != image_id.id) {
      pPVar10 = pPVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_00286d98:
    if ((pPVar10->id).id != image_id.id) {
      pPVar12 = pPVar10 + 1;
      goto LAB_00286da2;
    }
  }
  else {
    pPVar10 = pPVar1;
    if ((lVar7 == 3) && (pPVar10 = pPVar12, (pPVar12->id).id != image_id.id)) {
      pPVar10 = pPVar12 + 1;
      goto LAB_00286d98;
    }
  }
LAB_00286dc3:
  lVar9 = sVar4 * 0x14;
  pPVar12 = pPVar3;
  for (; 0 < lVar11; lVar11 = lVar11 + -1) {
    pPVar13 = pPVar12;
    if ((pPVar12->id).id == sampler_id.id) goto LAB_00286e43;
    if (pPVar12[1].id.id == sampler_id.id) {
      pPVar13 = pPVar12 + 1;
      goto LAB_00286e43;
    }
    if (pPVar12[2].id.id == sampler_id.id) {
      pPVar13 = pPVar12 + 2;
      goto LAB_00286e43;
    }
    if (pPVar12[3].id.id == sampler_id.id) {
      pPVar13 = pPVar12 + 3;
      goto LAB_00286e43;
    }
    pPVar12 = pPVar12 + 4;
    lVar9 = lVar9 + -0x50;
  }
  lVar9 = lVar9 / 0x14;
  if (lVar9 == 1) {
LAB_00286e22:
    pPVar13 = pPVar12;
    if ((pPVar12->id).id != sampler_id.id) {
      pPVar13 = pPVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_00286e18:
    pPVar13 = pPVar12;
    if ((pPVar12->id).id != sampler_id.id) {
      pPVar12 = pPVar12 + 1;
      goto LAB_00286e22;
    }
  }
  else {
    pPVar13 = pPVar1;
    if ((lVar9 == 3) && (pPVar13 = pPVar12, (pPVar12->id).id != sampler_id.id)) {
      pPVar12 = pPVar12 + 1;
      goto LAB_00286e18;
    }
  }
LAB_00286e43:
  if (pPVar10 == pPVar1) {
    param.image_id.id = image_id.id;
    if (pPVar13 == pPVar1) {
      return;
    }
LAB_00286e71:
    param._12_2_ = param._12_2_ & 0xff;
    param.sampler_id.id = (uint32_t)(((long)pPVar13 - (long)pPVar3) / 0x14);
  }
  else {
    param.global_image = false;
    param.global_sampler = true;
    param.image_id.id = (uint32_t)(((long)pPVar10 - (long)pPVar3) / 0x14);
    param.sampler_id.id = sampler_id.id;
    if (pPVar13 != pPVar1) goto LAB_00286e71;
  }
  local_80 = &caller->combined_parameters;
  __it = (caller->combined_parameters).
         super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar4 = (caller->combined_parameters).
          super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  lVar7 = sVar4 * 0x10;
  pCVar2 = __it + sVar4;
  local_a0 = (undefined1  [8])&param;
  param.depth = depth;
  local_78 = caller;
  for (lVar9 = (long)sVar4 >> 2; pCVar14 = __it, 0 < lVar9; lVar9 = lVar9 + -1) {
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it);
    if (bVar6) goto LAB_00286f83;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it + 1);
    pCVar14 = __it + 1;
    if (bVar6) goto LAB_00286f83;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it + 2);
    pCVar14 = __it + 2;
    if (bVar6) goto LAB_00286f83;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it + 3);
    pCVar14 = __it + 3;
    if (bVar6) goto LAB_00286f83;
    __it = __it + 4;
    lVar7 = lVar7 + -0x40;
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 == 1) {
LAB_002871d4:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it);
    pCVar14 = __it;
    if (!bVar6) goto LAB_00286f8e;
  }
  else if (lVar7 == 2) {
LAB_00286f61:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,pCVar14);
    if (!bVar6) {
      __it = pCVar14 + 1;
      goto LAB_002871d4;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_00286f8e;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Cross_spirv_cross_cpp:2842:21)>
                          *)local_a0,__it);
    if (!bVar6) {
      pCVar14 = __it + 1;
      goto LAB_00286f61;
    }
  }
LAB_00286f83:
  if (pCVar14 != pCVar2) {
    return;
  }
LAB_00286f8e:
  id_00 = ParsedIR::increase_bound_by(&this->compiler->ir,3);
  id.id = id_00 + 2;
  ptr_type_id = id_00 + 1;
  pSVar8 = expression_type(this->compiler,image_id.id);
  local_a0._0_4_ = 0x1b;
  this_00 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,id_00,(Op *)local_a0);
  local_a0._0_4_ = 0x20;
  this_01 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,id_00 + 1,(Op *)local_a0);
  SPIRType::operator=(this_00,pSVar8);
  (this_00->super_IVariant).self.id = id_00;
  this_00->basetype = SampledImage;
  this_00->pointer = false;
  this_00->storage = StorageClassGeneric;
  (this_00->image).depth = depth;
  SPIRType::operator=(this_01,this_00);
  this_01->pointer = true;
  this_01->storage = StorageClassUniformConstant;
  (this_01->parent_type).id = id_00;
  local_a0._0_4_ = 7;
  ts_2 = &local_70;
  local_70._M_dataplus._M_p._0_4_ = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,id.id,&ptr_type_id,(StorageClass *)local_a0,(int *)ts_2);
  bVar6 = ParsedIR::has_decoration(&this->compiler->ir,(ID)sampler_id.id,DecorationRelaxedPrecision)
  ;
  if (((bVar6) ||
      (bVar6 = ParsedIR::has_decoration
                         (&this->compiler->ir,(ID)image_id.id,DecorationRelaxedPrecision), bVar6))
     || ((combined_module_id.id != 0 &&
         (bVar6 = ParsedIR::has_decoration
                            (&this->compiler->ir,(ID)combined_module_id.id,
                             DecorationRelaxedPrecision), bVar6)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pCVar5 = this->compiler;
  param.id.id = id.id;
  (*pCVar5->_vptr_Compiler[6])(&local_70,pCVar5,(ulong)image_id.id,1);
  (*this->compiler->_vptr_Compiler[6])(&local_50,this->compiler,(ulong)sampler_id.id,1);
  join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
            ((string *)local_a0,(spirv_cross *)"SPIRV_Cross_Combined",(char (*) [21])&local_70,
             &local_50,ts_2);
  ParsedIR::set_name(&pCVar5->ir,id,(string *)local_a0);
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::push_back
            (local_80,&param);
  local_a0._4_4_ = id.id;
  local_a0._0_4_ = ptr_type_id;
  local_98 = 0;
  local_90._M_local_buf[0] = '\x01';
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
            (&local_78->shadow_arguments,(Parameter *)local_a0);
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id, OpTypeSampledImage);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id, OpTypePointer);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}